

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_fat.c
# Opt level: O0

int ENGINE_register_all_complete(void)

{
  ENGINE *e;
  ENGINE *local_8;
  
  for (local_8 = ENGINE_get_first(); local_8 != (ENGINE *)0x0; local_8 = ENGINE_get_next(local_8)) {
    if ((*(uint *)(local_8 + 0x98) & 8) == 0) {
      ENGINE_register_complete(local_8);
    }
  }
  return 1;
}

Assistant:

int ENGINE_register_all_complete(void)
{
    ENGINE *e;

    for (e = ENGINE_get_first(); e; e = ENGINE_get_next(e))
        if (!(e->flags & ENGINE_FLAGS_NO_REGISTER_ALL))
            ENGINE_register_complete(e);
    return 1;
}